

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

Col_Word Col_StringBufferFreeze(Col_Word strbuf)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  Col_Word CVar6;
  ulong uVar7;
  
  if (strbuf == 0) {
    uVar4 = 0;
  }
  else if ((strbuf & 0xf) == 0) {
    uVar4 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
  }
  else {
    uVar4 = immediateWordTypes[(uint)strbuf & 0x1f];
  }
  if ((uVar4 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
    strbuf = *(undefined8 *)(strbuf + 0x10);
  }
  uVar3 = *(ulong *)(strbuf + 0x10);
  if ((uVar3 == 0) || (*(long *)(strbuf + 8) != 0xc)) goto LAB_0010cfef;
  bVar1 = *(byte *)strbuf;
  bVar2 = *(byte *)(strbuf + 1);
  uVar4 = (uint)bVar2;
  if (1 < bVar2 - 1) {
    if (bVar2 == 0x24) {
      if (0xffff < uVar3) goto LAB_0010cfef;
      uVar4 = 1;
      uVar7 = 0;
      do {
        if (0xffff < *(uint *)(strbuf + uVar7 * 4 + 0x18)) {
          uVar4 = 4;
          break;
        }
        if (0xff < *(uint *)(strbuf + uVar7 * 4 + 0x18)) {
          uVar4 = 2;
        }
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
      uVar7 = 1;
      if (uVar4 == 1) {
        uVar7 = 7;
      }
      if (uVar3 <= uVar7) goto LAB_0010cfef;
      *(byte *)strbuf = 6;
      *(byte *)(strbuf + 1) = (byte)uVar4;
      *(short *)(strbuf + 2) = (short)uVar3;
      if ((bVar1 & 1) != 0) {
        *(byte *)strbuf = 7;
      }
      if (uVar4 == 1) {
        lVar5 = 0;
        do {
          *(byte *)(strbuf + lVar5 + 4) = *(byte *)(strbuf + lVar5 * 4 + 0x18);
          lVar5 = lVar5 + 1;
        } while (uVar3 + (uVar3 == 0) != lVar5);
        return (Col_Word)(byte *)strbuf;
      }
      if (uVar4 == 2) {
        lVar5 = 0;
        do {
          *(undefined2 *)(strbuf + lVar5 * 2 + 4) = *(undefined2 *)(strbuf + lVar5 * 4 + 0x18);
          lVar5 = lVar5 + 1;
        } while (uVar3 + (uVar3 == 0) != lVar5);
        return (Col_Word)(byte *)strbuf;
      }
      goto LAB_0010cf4d;
    }
    if (bVar2 != 4) goto LAB_0010cfef;
  }
  uVar7 = 1;
  if (bVar2 == 1) {
    uVar7 = 7;
  }
  if ((0xffff < uVar3) || (uVar3 <= uVar7)) {
LAB_0010cfef:
    CVar6 = Col_StringBufferValue(strbuf);
    return CVar6;
  }
  *(byte *)strbuf = 6;
  *(short *)(strbuf + 2) = (short)uVar3;
  if ((bVar1 & 1) != 0) {
    *(byte *)strbuf = 7;
  }
LAB_0010cf4d:
  memcpy((byte *)(strbuf + 4),(byte *)(strbuf + 0x18),uVar3 * (uVar4 & 7));
  return (Col_Word)(byte *)strbuf;
}

Assistant:

Col_Word
Col_StringBufferFreeze(
    Col_Word strbuf)    /*!< String buffer to freeze. */
{
    Col_StringFormat format;
    size_t length;
    int pinned;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return WORD_NIL;

    WORD_UNWRAP(strbuf);

    length = WORD_STRBUF_LENGTH(strbuf);
    if (length == 0 || WORD_STRBUF_ROPE(strbuf) != WORD_SMALLSTR_EMPTY) {
        /*
         * Buffer is empty or accumulated rope is not, return value.
         */

        return Col_StringBufferValue(strbuf);
    }

    /*
     * Turn word into rope.
     */

    pinned = WORD_PINNED(strbuf);
    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    switch (format) {
    case COL_UCS1:
    case COL_UCS2:
    case COL_UCS4:
        if (length > (format == COL_UCS1 ? SMALLSTR_MAX_LENGTH : 1)
                && length <= UCSSTR_MAX_LENGTH) {
            /*
             * Convert word in-place.
             */

            ASSERT(UCSSTR_HEADER_SIZE <= STRBUF_HEADER_SIZE);
            WORD_UCSSTR_INIT(strbuf, format, length);
            if (pinned) {
                WORD_SET_PINNED(strbuf);
            }
            memcpy((void *) WORD_UCSSTR_DATA(strbuf),
                    WORD_STRBUF_BUFFER(strbuf),
                    length * CHAR_WIDTH(format));
            return strbuf;
        }
        break;

    case COL_UCS:
        if (length <= UCSSTR_MAX_LENGTH) {
            /*
             * Compute format.
             */

            Col_Char4 *data = (Col_Char4 *) WORD_STRBUF_BUFFER(strbuf);
            size_t i;
            format = COL_UCS1;
            for (i=0; i < length; i++) {
                if (data[i] > COL_CHAR2_MAX) {
                    format = COL_UCS4;
                    break;
                } else if (data[i] > COL_CHAR1_MAX) {
                    format = COL_UCS2;
                }
            }

            if (length <= (format == COL_UCS1 ? SMALLSTR_MAX_LENGTH : 1)) {
                /*
                 * Fits immediate string.
                 */

                break;
            }

            /*
             * Convert word in-place.
             */

            ASSERT(UCSSTR_HEADER_SIZE <= STRBUF_HEADER_SIZE);
            WORD_UCSSTR_INIT(strbuf, format, length);
            if (pinned) {
                WORD_SET_PINNED(strbuf);
            }
            if (format == COL_UCS1) {
                Col_Char1 *data1 = (Col_Char1 *) WORD_UCSSTR_DATA(strbuf);
                for (i=0; i < length; i++) {
                    *data1++ = *data++;
                }
            } else if (format == COL_UCS2) {
                Col_Char2 *data2 = (Col_Char2 *) WORD_UCSSTR_DATA(strbuf);
                for (i=0; i < length; i++) {
                    *data2++ = *data++;
                }
            } else {
                ASSERT(format == COL_UCS4);
                memcpy((void *) WORD_UCSSTR_DATA(strbuf),
                        WORD_STRBUF_BUFFER(strbuf),
                        length * CHAR_WIDTH(format));
            }
            return strbuf;
        }
        break;
    }

    /*
     * Could not convert in-place (either too large or fits immediate word),
     * return value.
     */

    return Col_StringBufferValue(strbuf);
}